

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpruneL.c
# Opt level: O1

void zpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int_t *piVar9;
  int_t *piVar10;
  void *pvVar11;
  int_t *piVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int in_R10D;
  ulong uVar20;
  uint unaff_R14D;
  doublecomplex utemp;
  
  if (0 < nseg) {
    piVar7 = Glu->xsup;
    piVar8 = Glu->supno;
    piVar9 = Glu->lsub;
    piVar10 = Glu->xlsub;
    pvVar11 = Glu->lusup;
    piVar12 = Glu->xlusup;
    iVar3 = piVar8[jcol];
    uVar20 = 0;
    do {
      iVar4 = segrep[uVar20];
      if (((repfnz[iVar4] != -1) && (iVar5 = piVar8[iVar4], iVar5 != piVar8[(long)iVar4 + 1])) &&
         (iVar5 != iVar3)) {
        iVar6 = piVar10[(long)iVar4 + 1];
        bVar13 = true;
        if (iVar6 <= xprune[iVar4]) {
          unaff_R14D = piVar10[iVar4];
          in_R10D = iVar6 + -1;
          if ((int)unaff_R14D < iVar6) {
            lVar17 = 0;
            do {
              bVar13 = piVar9[(int)unaff_R14D + lVar17] != pivrow;
              if (piVar9[(int)unaff_R14D + lVar17] == pivrow) break;
              iVar19 = (int)lVar17;
              lVar17 = lVar17 + 1;
            } while (~unaff_R14D + iVar6 != iVar19);
          }
        }
        if (!bVar13) {
          if ((int)unaff_R14D <= in_R10D) {
            iVar5 = piVar7[iVar5];
            do {
              if (perm_r[piVar9[in_R10D]] == -1) {
LAB_0010ac2b:
                in_R10D = in_R10D + -1;
              }
              else {
                iVar6 = piVar9[(int)unaff_R14D];
                if (perm_r[iVar6] == -1) {
                  piVar9[(int)unaff_R14D] = piVar9[in_R10D];
                  piVar9[in_R10D] = iVar6;
                  if (iVar4 == iVar5) {
                    lVar18 = (long)(int)((piVar12[iVar4] + unaff_R14D) - piVar10[iVar4]) * 0x10;
                    puVar1 = (undefined8 *)((long)pvVar11 + lVar18);
                    uVar14 = *puVar1;
                    uVar15 = puVar1[1];
                    lVar17 = (long)((piVar12[iVar4] + in_R10D) - piVar10[iVar4]) * 0x10;
                    puVar1 = (undefined8 *)((long)pvVar11 + lVar17);
                    uVar16 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pvVar11 + lVar18);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar16;
                    puVar1 = (undefined8 *)((long)pvVar11 + lVar17);
                    *puVar1 = uVar14;
                    puVar1[1] = uVar15;
                  }
                  unaff_R14D = unaff_R14D + 1;
                  goto LAB_0010ac2b;
                }
                unaff_R14D = unaff_R14D + 1;
              }
            } while ((int)unaff_R14D <= in_R10D);
          }
          xprune[iVar4] = unaff_R14D;
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)nseg);
  }
  return;
}

Assistant:

void
zpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    doublecomplex     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    doublecomplex     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After zpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}